

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O1

int Abc_FrameReadMode(Abc_Frame_t *p)

{
  int iVar1;
  char *__nptr;
  
  __nptr = Cmd_FlagReadByName(p,"namemode");
  if (__nptr != (char *)0x0) {
    iVar1 = atoi(__nptr);
    return iVar1;
  }
  return 0;
}

Assistant:

int Abc_FrameReadMode( Abc_Frame_t * p )
{
    int fShortNames;
    char * pValue;
    pValue = Cmd_FlagReadByName( p, "namemode" );
    if ( pValue == NULL )
        fShortNames = 0;
    else 
        fShortNames = atoi(pValue);
    return fShortNames;
}